

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_to_byte_array(vm_val_t *retval,vm_val_t *self_val,char *str,uint *oargc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  vm_val_t *mapval;
  uint uVar6;
  
  if (oargc == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *oargc;
  }
  if (getp_to_byte_array(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_to_byte_array(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                 ::desc);
    if (iVar4 != 0) {
      getp_to_byte_array::desc.min_argc_ = 0;
      getp_to_byte_array::desc.opt_argc_ = 1;
      getp_to_byte_array::desc.varargs_ = 0;
      __cxa_guard_release(&getp_to_byte_array(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                           desc);
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_to_byte_array::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    mapval = (vm_val_t *)0x0;
    if (0 < (int)uVar6) {
      mapval = sp_ + -1;
    }
    uVar2 = *(undefined4 *)&self_val->field_0x4;
    aVar1 = self_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = self_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    vVar5 = CVmObjByteArray::create_from_string(self_val,str,mapval);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
    sp_ = sp_ + (int)~uVar6;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_to_byte_array(VMG_ vm_val_t *retval,
                                     const vm_val_t *self_val,
                                     const char *str, uint *oargc)
{
    /* check arguments */
    int argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* note the mapper argument */
    const vm_val_t *cmap = (argc >= 1 ? G_stk->get(0) : 0);

    /* save the string for gc protection */
    G_stk->push(self_val);

    /* create the byte array */
    retval->set_obj(CVmObjByteArray::create_from_string(
        vmg_ self_val, str, cmap));

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}